

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O0

void __thiscall JSONNode::cast(JSONNode *this,char newtype)

{
  internalJSONNode *piVar1;
  byte bVar2;
  bool val;
  uint uVar3;
  json_number val_00;
  allocator local_a1;
  json_string local_a0;
  JSONNode local_80;
  JSONNode local_78;
  json_string local_70;
  allocator local_39;
  json_string local_38;
  char local_11;
  JSONNode *pJStack_10;
  char newtype_local;
  JSONNode *this_local;
  
  piVar1 = this->internal;
  local_11 = newtype;
  pJStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"no internal",&local_39);
  JSONDebug::_JSON_ASSERT(piVar1 != (internalJSONNode *)0x0,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  uVar3 = (uint)local_11;
  bVar2 = type(this);
  if (uVar3 != bVar2) {
    switch(local_11) {
    case '\0':
      nullify(this);
      break;
    case '\x01':
      as_string_abi_cxx11_(&local_70,this);
      operator=(this,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      break;
    case '\x02':
      val_00 = as_float(this);
      operator=(this,val_00);
      break;
    case '\x03':
      val = as_bool(this);
      operator=(this,val);
      break;
    case '\x04':
      as_array(&local_78);
      operator=(this,&local_78);
      ~JSONNode(&local_78);
      break;
    case '\x05':
      as_node(&local_80);
      operator=(this,&local_80);
      ~JSONNode(&local_80);
      break;
    default:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_a0,"cast to unknown type",&local_a1);
      JSONDebug::_JSON_FAIL(&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    }
  }
  return;
}

Assistant:

void JSONNode::cast(char newtype) json_nothrow {
	   JSON_CHECK_INTERNAL();
	   if (newtype == type()) return;

	   switch(newtype){
		  case JSON_NULL:
			 nullify();
			 return;
		  case JSON_STRING:
			 *this = as_string();
			 return;
		  case JSON_NUMBER:
			 *this = as_float();
			 return;
		  case JSON_BOOL:
			 *this = as_bool();
			 return;
		  case JSON_ARRAY:
			 *this = as_array();
			 return;
		  case JSON_NODE:
			 *this = as_node();
			 return;
	   }
	   JSON_FAIL(JSON_TEXT("cast to unknown type"));
    }